

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

int socketSet(char *where,mpt_fdmode *mode,_func_int_varargs *operation)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  char cVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  char *__service;
  char *__name;
  addrinfo *paVar11;
  undefined1 uVar12;
  addrinfo *res;
  sockaddr_un addr;
  addrinfo *local_b0;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  
  bVar1 = mode->family;
  if (bVar1 < 2) {
    if (bVar1 == 0) goto LAB_00103ba1;
    if (bVar1 != 1) goto LAB_00103c06;
    sVar8 = strlen(where);
    if (0x6b < sVar8) {
      piVar9 = __errno_location();
      *piVar9 = 0x22;
      goto LAB_00103d8b;
    }
    uVar6 = socket(1,(uint)(mode->param).sock.type,(uint)(mode->param).sock.proto);
    if ((int)uVar6 < 0) {
      return uVar6;
    }
    local_a8._0_2_ = 1;
    memcpy(local_a8 + 2,where,sVar8 + 1);
    iVar7 = (*operation)((ulong)uVar6,local_a8,0x6e);
    if (iVar7 < 0) {
      close(uVar6);
      return -1;
    }
LAB_00103d97:
    mode->stream = (ushort)((mode->param).sock.type == '\x01') * 4 + 3;
  }
  else {
    if ((bVar1 != 2) && (bVar1 != 10)) {
LAB_00103c06:
      piVar9 = __errno_location();
      *piVar9 = 0x5d;
      return -4;
    }
LAB_00103ba1:
    if ((bVar1 == 2) || (*where != '[')) {
      pcVar10 = strrchr(where,0x3a);
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (char *)0x0;
        cVar5 = '\0';
        __service = (char *)0x0;
      }
      else {
        cVar5 = *pcVar10;
        *pcVar10 = '\0';
        __service = pcVar10 + 1;
      }
LAB_00103c23:
      local_88 = (undefined1  [16])0x0;
      local_a8._16_16_ = (undefined1  [16])0x0;
      uVar2 = (mode->param).file.open;
      uVar12 = (undefined1)(uVar2 >> 8);
      auVar4._4_8_ = (ulong)(CONCAT14(uVar12,(uint)CONCAT12(uVar12,uVar2)) & 0xffffff00ff) &
                     0xffffffff0000ffff;
      auVar4._0_4_ = (int)mode->family;
      auVar4._12_4_ = 0;
      local_a8._0_16_ = auVar4 << 0x20;
      __name = (char *)0x0;
      if (*where != '\0') {
        __name = where;
      }
      iVar7 = getaddrinfo(__name,__service,(addrinfo *)local_a8,&local_b0);
      if (cVar5 != '\0' && pcVar10 != (char *)0x0) {
        *pcVar10 = cVar5;
      }
      if (iVar7 == 0) {
        paVar11 = local_b0;
        if (local_b0 == (addrinfo *)0x0) {
          uVar6 = 0xffffffff;
        }
        else {
          do {
            cVar5 = (char)paVar11->ai_family;
            mode->family = cVar5;
            uVar6 = paVar11->ai_socktype;
            (mode->param).sock.type = (uint8_t)uVar6;
            uVar3 = paVar11->ai_protocol;
            (mode->param).sock.proto = (uint8_t)uVar3;
            uVar6 = socket((int)cVar5,uVar6 & 0xff,uVar3 & 0xff);
            if (((int)uVar6 < 0) ||
               (iVar7 = (*operation)((ulong)uVar6,paVar11->ai_addr,(ulong)paVar11->ai_addrlen),
               -1 < iVar7)) goto LAB_00103d10;
            paVar11 = paVar11->ai_next;
            piVar9 = __errno_location();
            *piVar9 = 0x5c;
            close(uVar6);
          } while (paVar11 != (addrinfo *)0x0);
          uVar6 = 0xffffffff;
LAB_00103d10:
          if (local_b0 != (addrinfo *)0x0) {
            freeaddrinfo(local_b0);
          }
        }
        goto LAB_00103d97;
      }
      if (iVar7 != -3) {
        if (iVar7 == -0xb) {
          return -1;
        }
        return -3;
      }
    }
    else {
      where = where + 1;
      pcVar10 = strchr(where,0x5d);
      if (pcVar10 != (char *)0x0) {
        cVar5 = *pcVar10;
        *pcVar10 = '\0';
        __service = (char *)0x0;
        if (pcVar10[1] == ':') {
          __service = pcVar10 + 2;
        }
        goto LAB_00103c23;
      }
      piVar9 = __errno_location();
      *piVar9 = 0x5f;
    }
LAB_00103d8b:
    uVar6 = 0xfffffffe;
  }
  return uVar6;
}

Assistant:

static int socketSet(const char *where, MPT_STRUCT(fdmode) *mode, int (*operation)())
{
	int len, sock;
	
	/* unix socket */
	if (mode->family == AF_UNIX) {
		struct sockaddr_un addr;
		size_t len;
		
		if ((len = strlen(where)) >= sizeof(addr.sun_path)) {
			errno = ERANGE;
			return -2;
		}
		if ((sock = socket(AF_UNIX, mode->param.sock.type, mode->param.sock.proto)) < 0) {
			return sock;
		}
		addr.sun_family = AF_UNIX;
		memcpy(addr.sun_path, where, len+1);
		if (operation(sock, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
			(void) close(sock);
			return -1;
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	/* ip socket */
	else if (mode->family == AF_INET || mode->family == AF_INET6 || mode->family == AF_UNSPEC) {
		struct addrinfo hints, *res, *curr;
		char *port, *end, save = 0;
		
		if (mode->family != AF_INET && *where == '[') {
			if (!(end = strchr(++where, ']'))) {
				errno = ENOTSUP;
				return -2;
			}
			save = *end;
			*end = 0;
			port = (end[1] == ':') ? end+2 : 0;
		}
		else if ((end = port = strrchr(where, ':'))) {
			save = *end;
			*port++ = 0;
		}
		memset(&hints, 0, sizeof(hints));
		hints.ai_family   = mode->family;
		hints.ai_socktype = mode->param.sock.type;
		hints.ai_protocol = mode->param.sock.proto;
		
		if (!*where) {
			where = 0;
		}
		len = getaddrinfo(where, port, &hints, &res);
		
		if (end && save) {
			*end = save;
		}
		switch (len) {
		  case 0: break;
		  case EAI_AGAIN: return -2;
		  case EAI_SYSTEM: return -1;
		  default: return -3;
		}
		curr = res;
		sock = -1;
		
		while (curr) {
			mode->family           = curr->ai_family;
			mode->param.sock.type  = curr->ai_socktype;
			mode->param.sock.proto = curr->ai_protocol;
			
			if ((sock = socket(mode->family, mode->param.sock.type, mode->param.sock.proto)) < 0) {
				break;
			}
			if (operation(sock, curr->ai_addr, curr->ai_addrlen) >= 0) {
				break;
			}
			curr = curr->ai_next;
			
			errno = ENOPROTOOPT;
			(void) close(sock);
			sock = -1;
		}
		if (res) {
			freeaddrinfo(res);
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	else {
		errno = EPROTONOSUPPORT;
		return -4;
	}
	return sock;
}